

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

string * __thiscall cmdline::parser::usage_abi_cxx11_(string *__return_storage_ptr__,parser *this)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  const_reference ppoVar6;
  unsigned_long *puVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong local_1f0;
  size_t j;
  size_t i_2;
  ulong local_1d8;
  size_t i_1;
  size_t max_width;
  ulong local_1a8;
  size_t i;
  ostringstream local_190 [8];
  ostringstream oss;
  parser *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar4 = std::operator<<((ostream *)local_190,"usage: ");
  poVar4 = std::operator<<(poVar4,(string *)&this->prog_name);
  std::operator<<(poVar4," ");
  for (local_1a8 = 0; uVar1 = local_1a8,
      sVar5 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::size(&this->ordered), uVar1 < sVar5; local_1a8 = local_1a8 + 1) {
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[](&this->ordered,local_1a8);
    uVar2 = (*(*ppoVar6)->_vptr_option_base[7])();
    if ((uVar2 & 1) != 0) {
      ppoVar6 = std::
                vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ::operator[](&this->ordered,local_1a8);
      (*(*ppoVar6)->_vptr_option_base[0xb])(&max_width);
      poVar4 = std::operator<<((ostream *)local_190,(string *)&max_width);
      std::operator<<(poVar4," ");
      std::__cxx11::string::~string((string *)&max_width);
    }
  }
  poVar4 = std::operator<<((ostream *)local_190,"[options] ... ");
  poVar4 = std::operator<<(poVar4,(string *)&this->ftr);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)local_190,"options:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  i_1 = 0;
  for (local_1d8 = 0; uVar1 = local_1d8,
      sVar5 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::size(&this->ordered), uVar1 < sVar5; local_1d8 = local_1d8 + 1) {
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[](&this->ordered,local_1d8);
    (*(*ppoVar6)->_vptr_option_base[8])();
    i_2 = std::__cxx11::string::length();
    puVar7 = std::max<unsigned_long>(&i_1,&i_2);
    i_1 = *puVar7;
  }
  for (j = 0; sVar5 = std::
                      vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                      ::size(&this->ordered), j < sVar5; j = j + 1) {
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[](&this->ordered,j);
    iVar3 = (*(*ppoVar6)->_vptr_option_base[9])();
    if ((char)iVar3 == '\0') {
      std::operator<<((ostream *)local_190,"      ");
    }
    else {
      poVar4 = std::operator<<((ostream *)local_190,"  -");
      ppoVar6 = std::
                vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                ::operator[](&this->ordered,j);
      iVar3 = (*(*ppoVar6)->_vptr_option_base[9])();
      poVar4 = std::operator<<(poVar4,(char)iVar3);
      std::operator<<(poVar4,", ");
    }
    poVar4 = std::operator<<((ostream *)local_190,"--");
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[](&this->ordered,j);
    iVar3 = (*(*ppoVar6)->_vptr_option_base[8])();
    std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[](&this->ordered,j);
    (*(*ppoVar6)->_vptr_option_base[8])();
    for (local_1f0 = std::__cxx11::string::length(); local_1f0 < i_1 + 4; local_1f0 = local_1f0 + 1)
    {
      std::operator<<((ostream *)local_190,' ');
    }
    ppoVar6 = std::
              vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
              ::operator[](&this->ordered,j);
    iVar3 = (*(*ppoVar6)->_vptr_option_base[10])();
    poVar4 = std::operator<<((ostream *)local_190,(string *)CONCAT44(extraout_var_00,iVar3));
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string usage() const
		{
			std::ostringstream oss;
			oss << "usage: " << prog_name << " ";
			for(size_t i = 0; i < ordered.size(); i++)
			{
				if(ordered[i]->must())
					oss << ordered[i]->short_description() << " ";
			}

			oss << "[options] ... " << ftr << std::endl;
			oss << "options:" << std::endl;

			size_t max_width = 0;
			for(size_t i = 0; i < ordered.size(); i++)
			{
				max_width = std::max(max_width, ordered[i]->name().length());
			}
			for(size_t i = 0; i < ordered.size(); i++)
			{
				if(ordered[i]->short_name())
				{
					oss << "  -" << ordered[i]->short_name() << ", ";
				}
				else
				{
					oss << "      ";
				}

				oss << "--" << ordered[i]->name();
				for(size_t j = ordered[i]->name().length(); j < max_width + 4; j++)
					oss << ' ';
				oss << ordered[i]->description() << std::endl;
			}
			return oss.str();
		}